

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseSourceName(State *state)

{
  ulong uVar1;
  char cVar2;
  char *str;
  uint uVar3;
  long lVar4;
  bool bVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  int length;
  State copy;
  uint local_4c;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  local_48 = state->mangled_cur;
  pcStack_40 = state->out_cur;
  local_38 = state->out_begin;
  pcStack_30 = state->out_end;
  local_28 = state->prev_name;
  uStack_20._0_4_ = state->prev_name_length;
  uStack_20._4_2_ = state->nest_level;
  uStack_20._6_1_ = state->append;
  uStack_20._7_1_ = state->overflowed;
  local_4c = 0xffffffff;
  bVar5 = ParseNumber(state,(int *)&local_4c);
  uVar3 = local_4c;
  if ((!bVar5) || (uVar9 = (ulong)local_4c, uVar9 == 0xffffffff)) goto LAB_0011fac1;
  str = state->mangled_cur;
  if (0 < (int)local_4c) {
    cVar2 = *str;
    if (cVar2 == '\0') {
LAB_0011fac1:
      state->prev_name = local_28;
      state->prev_name_length = (undefined4)uStack_20;
      state->nest_level = uStack_20._4_2_;
      state->append = (bool)uStack_20._6_1_;
      state->overflowed = (bool)uStack_20._7_1_;
      state->out_begin = local_38;
      state->out_end = pcStack_30;
      state->mangled_cur = local_48;
      state->out_cur = pcStack_40;
      return false;
    }
    uVar7 = 0;
    do {
      if (uVar9 - 1 == uVar7) goto LAB_0011fadf;
      uVar1 = uVar7 + 1;
      lVar4 = uVar7 + 1;
      uVar7 = uVar1;
    } while (str[lVar4] != '\0');
    if (uVar1 < uVar9) goto LAB_0011fac1;
LAB_0011fadf:
    if (0xb < (int)local_4c) {
      lVar4 = 0;
      do {
        lVar6 = lVar4;
        cVar8 = "_GLOBAL__N_"[lVar6];
        if (cVar2 != cVar8) goto LAB_0011fb06;
        cVar2 = str[lVar6 + 1];
        lVar4 = lVar6 + 1;
      } while (cVar2 != '\0');
      cVar8 = "_GLOBAL__N_"[lVar6 + 1];
LAB_0011fb06:
      if (cVar8 == '\0') {
        MaybeAppend(state,"(anonymous namespace)");
        goto LAB_0011fb16;
      }
    }
  }
  MaybeAppendWithLength(state,str,local_4c);
LAB_0011fb16:
  state->mangled_cur = state->mangled_cur + (int)uVar3;
  return true;
}

Assistant:

static bool ParseSourceName(State *state) {
  State copy = *state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  *state = copy;
  return false;
}